

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::SortingColumn::printTo(SortingColumn *this,ostream *out)

{
  ostream *poVar1;
  string local_40;
  
  std::operator<<(out,"SortingColumn(");
  poVar1 = std::operator<<(out,"column_idx=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->column_idx);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"descending=");
  duckdb_apache::thrift::to_string<bool>(&local_40,&this->descending);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"nulls_first=");
  duckdb_apache::thrift::to_string<bool>(&local_40,&this->nulls_first);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(out,")");
  return;
}

Assistant:

void SortingColumn::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "SortingColumn(";
  out << "column_idx=" << to_string(column_idx);
  out << ", " << "descending=" << to_string(descending);
  out << ", " << "nulls_first=" << to_string(nulls_first);
  out << ")";
}